

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O3

void work_mgga_exc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  uint uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar25 [16];
  double dVar22;
  double dVar23;
  double dVar32;
  undefined1 auVar26 [16];
  double dVar24;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar39;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 uVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double local_1b8;
  double local_1a0;
  double local_168;
  
  if (np != 0) {
    local_1a0 = 0.0;
    sVar5 = 0;
    do {
      lVar4 = (long)(p->dim).rho * sVar5;
      dVar7 = rho[lVar4];
      if (p->nspin == 2) {
        dVar7 = dVar7 + rho[lVar4 + 1];
      }
      dVar52 = p->dens_threshold;
      if (dVar52 <= dVar7) {
        dVar7 = rho[lVar4];
        if (rho[lVar4] <= dVar52) {
          dVar7 = dVar52;
        }
        dVar8 = p->sigma_threshold * p->sigma_threshold;
        local_1b8 = sigma[(long)(p->dim).sigma * sVar5];
        if (sigma[(long)(p->dim).sigma * sVar5] <= dVar8) {
          local_1b8 = dVar8;
        }
        uVar1 = p->info->flags;
        if ((uVar1 >> 0x10 & 1) != 0) {
          local_1a0 = tau[(long)(p->dim).tau * sVar5];
          if (tau[(long)(p->dim).tau * sVar5] <= p->tau_threshold) {
            local_1a0 = p->tau_threshold;
          }
          if (((uVar1 >> 0x11 & 1) != 0) && (dVar8 = dVar7 * 8.0 * local_1a0, dVar8 <= local_1b8)) {
            local_1b8 = dVar8;
          }
        }
        dVar8 = p->zeta_threshold;
        dVar33 = (double)(-(ulong)(dVar8 < 1.0) & 0x3ff0000000000000 |
                         ~-(ulong)(dVar8 < 1.0) & (ulong)(dVar8 + -1.0 + 1.0));
        uVar6 = -(ulong)(dVar33 <= dVar8);
        dVar33 = (double)(uVar6 & (ulong)dVar8 | ~uVar6 & (ulong)dVar33);
        dVar9 = cbrt(dVar33);
        dVar10 = cbrt(dVar7);
        dVar8 = (1.0 / local_1a0) * (1.0 / dVar7) * local_1b8 * 0.125;
        if (1.0 <= dVar8) {
          dVar8 = 1.0;
        }
        dVar11 = dVar8 * dVar8 * dVar8;
        dVar12 = cbrt(9.0);
        dVar13 = cbrt(0.3183098861837907);
        dVar21 = (1.0 / dVar10) * 1.4422495703074083 *
                 dVar13 * dVar13 * dVar12 * dVar12 * p->cam_omega;
        dVar12 = cbrt(9.869604401089358);
        dVar45 = 1.0 / (dVar10 * dVar10);
        auVar40._0_8_ = dVar7 * dVar7;
        auVar40._8_8_ = dVar12 * dVar12;
        auVar25._8_8_ = 0x3ff0000000000000;
        auVar25._0_8_ = dVar45;
        auVar25 = divpd(auVar25,auVar40);
        dVar34 = local_1b8 * 1.5874010519681996 * auVar25._0_8_;
        dVar32 = auVar25._8_8_;
        dVar13 = dVar34 * dVar32 * 1.8171205928321397;
        dVar38 = ((1.0 / dVar12) / 9.869604401089358) * 3.3019272488946267 * 0.00537989809245259 *
                 local_1b8 * local_1b8 * 1.2599210498948732 *
                 ((1.0 / dVar10) / (auVar40._0_8_ * auVar40._0_8_ * dVar7)) +
                 dVar13 * 0.1504548888888889 + 1.0;
        dVar12 = pow(dVar38,0.1);
        auVar31._8_8_ = dVar12;
        auVar31._0_8_ = dVar9;
        auVar25 = divpd(_DAT_0101f460,auVar31);
        dVar14 = (auVar25._8_8_ * auVar25._0_8_ * dVar21) / 18.0;
        dVar12 = 1e-10;
        if (1e-10 <= dVar14) {
          dVar12 = dVar14;
        }
        dVar14 = 1.35;
        if (dVar12 <= 1.35) {
          dVar14 = dVar12;
        }
        dVar15 = erf((1.0 / dVar14) * 0.5);
        dVar16 = exp((-1.0 / (dVar14 * dVar14)) * 0.25);
        if (1.35 <= dVar12) {
          dVar14 = dVar12;
          if (dVar12 <= 1.35) {
            dVar14 = 1.35;
          }
          auVar43._0_8_ = dVar14 * dVar14;
          dVar14 = auVar43._0_8_ * auVar43._0_8_;
          auVar43._8_8_ = dVar14;
          dVar15 = dVar14 * dVar14;
          auVar60._0_8_ = auVar43._0_8_ * dVar14;
          auVar60._8_8_ = dVar15 * dVar15;
          auVar31 = divpd(_DAT_0101f460,auVar43);
          auVar61 = divpd(auVar31,_DAT_0102ddd0);
          auVar54._8_8_ = dVar15;
          auVar54._0_8_ = auVar60._0_8_;
          auVar54 = divpd(_DAT_0101f460,auVar54);
          uVar44 = auVar54._8_8_;
          auVar51._8_8_ = 0x3ff0000000000000;
          auVar51._0_8_ = uVar44;
          auVar31 = divpd(auVar51,auVar60);
          auVar57._8_8_ = uVar44;
          auVar57._0_8_ = uVar44;
          auVar43 = divpd(auVar57,auVar43);
          auVar51 = divpd(auVar54,_DAT_0102dde0);
          auVar43 = divpd(auVar43,_DAT_0102ddf0);
          auVar31 = divpd(auVar31,_DAT_0102de00);
          local_168 = ((((((auVar61._0_8_ - auVar61._8_8_) + auVar51._0_8_) - auVar51._8_8_) +
                        auVar43._0_8_) - auVar43._8_8_) + auVar31._0_8_) - auVar31._8_8_;
        }
        else {
          local_168 = dVar14 * -2.6666666666666665 *
                      (dVar15 * 1.7724538509055159 +
                      (dVar16 + -1.5 + (dVar16 + -1.0) * dVar14 * dVar14 * -2.0) * (dVar14 + dVar14)
                      ) + 1.0;
        }
        dVar38 = pow(dVar38,0.2);
        dVar14 = 0.27;
        if (dVar12 <= 0.27) {
          dVar14 = dVar12;
        }
        dVar22 = dVar14 * dVar14;
        dVar15 = exp((-1.0 / dVar22) * 0.25);
        dVar16 = erf((1.0 / dVar14) * 0.5);
        if (0.27 <= dVar12) {
          dVar14 = dVar12;
          if (dVar12 <= 0.27) {
            dVar14 = 0.27;
          }
          auVar35._0_8_ = dVar14 * dVar14;
          auVar26._0_8_ = auVar35._0_8_ * auVar35._0_8_;
          auVar17._0_8_ = auVar35._0_8_ * auVar26._0_8_;
          auVar17._8_8_ = auVar26._0_8_ * auVar26._0_8_;
          auVar46._0_8_ = auVar26._0_8_ * auVar17._8_8_;
          auVar46._8_8_ = auVar17._0_8_ * auVar17._8_8_;
          dVar14 = auVar17._8_8_ * auVar17._8_8_;
          auVar50._0_8_ = auVar35._0_8_ * auVar17._8_8_;
          auVar50._8_8_ = auVar35._0_8_ * dVar14;
          auVar58._0_8_ = 1.0 / (dVar14 * dVar14);
          auVar41._8_8_ = 0x3ff0000000000000;
          auVar41._0_8_ = auVar58._0_8_;
          auVar64._8_8_ = 0x3ff0000000000000;
          auVar64._0_8_ = auVar58._0_8_;
          auVar61._8_8_ = dVar14;
          auVar61._0_8_ = auVar17._8_8_;
          auVar51 = divpd(auVar64,auVar61);
          dVar14 = auVar51._8_8_;
          auVar66._0_8_ = -dVar14;
          auVar66._8_8_ = dVar14;
          auVar31 = divpd(auVar66,auVar17);
          auVar61 = divpd(auVar31,_DAT_0108f8a0);
          auVar62._8_8_ = auVar50._0_8_;
          auVar62._0_8_ = auVar46._0_8_;
          auVar65._8_8_ = dVar14;
          auVar65._0_8_ = dVar14;
          auVar31 = divpd(auVar65,auVar62);
          auVar66 = divpd(auVar31,_DAT_0108f8b0);
          auVar63._8_8_ = dVar14 / auVar46._8_8_;
          auVar63._0_8_ = auVar58._0_8_;
          auVar64 = divpd(auVar63,_DAT_0108f8c0);
          auVar58._8_8_ = auVar58._0_8_;
          auVar31 = divpd(auVar58,auVar46);
          auVar60 = divpd(auVar31,_DAT_0108f8d0);
          auVar35._8_8_ = auVar50._0_8_;
          auVar55._8_8_ = 0x3ff0000000000000;
          auVar55._0_8_ = auVar58._0_8_;
          auVar31 = divpd(auVar55,auVar35);
          auVar57 = divpd(auVar31,_DAT_0108f8e0);
          auVar26._8_8_ = auVar46._0_8_;
          auVar36._8_8_ = 0x3ff0000000000000;
          auVar36._0_8_ = auVar58._0_8_;
          auVar31 = divpd(auVar36,auVar26);
          auVar43 = divpd(auVar31,_DAT_0108f8f0);
          auVar47._8_8_ = auVar46._8_8_;
          auVar47._0_8_ = auVar17._0_8_;
          auVar18._8_8_ = 0x3ff0000000000000;
          auVar18._0_8_ = auVar58._0_8_;
          auVar31 = divpd(auVar18,auVar47);
          auVar31 = divpd(auVar31,_DAT_0108f900);
          auVar54 = divpd(auVar51,_DAT_0108f910);
          auVar51 = divpd(auVar41,auVar50);
          auVar51 = divpd(auVar51,_DAT_0108f920);
          dVar14 = auVar51._8_8_ +
                   auVar54._8_8_ +
                   auVar31._8_8_ +
                   auVar43._8_8_ +
                   auVar57._8_8_ +
                   (1.0 / auVar17._8_8_) * 3.804788961038961e-06 +
                   (1.0 / auVar17._0_8_) / -11520.0 +
                   0.0013392857142857143 / auVar26._0_8_ + (auVar60._0_8_ - auVar60._8_8_) +
                   (dVar14 / auVar26._0_8_) / 927028425523200.0 +
                   auVar51._0_8_ +
                   auVar54._0_8_ +
                   auVar31._0_8_ +
                   auVar43._0_8_ +
                   auVar57._0_8_ +
                   ((((auVar61._8_8_ + auVar61._0_8_) - auVar66._8_8_) + auVar66._0_8_) -
                   auVar64._8_8_) + auVar64._0_8_;
        }
        else {
          dVar23 = dVar22 * dVar22 * 64.0;
          dVar14 = dVar22 * 24.0 *
                   (dVar22 * -36.0 +
                    dVar14 * 17.724538509055158 * dVar16 + (dVar22 * 20.0 - dVar23) * dVar15 +
                    dVar23 + -3.0) + 1.0;
        }
        dVar15 = (dVar45 / dVar7) * local_1a0 * 1.5874010519681996;
        dVar16 = dVar15 * 0.14554132;
        dVar45 = 0.32;
        if (dVar12 <= 0.32) {
          dVar45 = dVar12;
        }
        dVar24 = dVar45 * dVar45;
        dVar22 = exp((-1.0 / dVar24) * 0.25);
        dVar23 = erf((1.0 / dVar45) * 0.5);
        if (0.32 <= dVar12) {
          if (dVar12 <= 0.32) {
            dVar12 = 0.32;
          }
          dVar12 = dVar12 * dVar12;
          dVar45 = dVar12 * dVar12;
          dVar22 = dVar12 * dVar45;
          auVar19._8_8_ = dVar22;
          auVar19._0_8_ = dVar45;
          auVar27._0_8_ = dVar45 * dVar45;
          dVar23 = auVar27._0_8_ * auVar27._0_8_;
          auVar48._0_8_ = 1.0 / dVar23;
          auVar48._8_8_ = auVar48._0_8_;
          auVar56._8_8_ = auVar48._0_8_;
          auVar56._0_8_ = auVar48._0_8_;
          auVar59._8_8_ = auVar48._0_8_;
          auVar59._0_8_ = auVar48._0_8_;
          auVar3._8_8_ = auVar27._0_8_ * dVar22;
          auVar3._0_8_ = auVar27._0_8_ * dVar45;
          auVar31 = divpd(auVar48,auVar3);
          auVar53._8_8_ = auVar48._0_8_ / dVar12;
          auVar53._0_8_ = auVar48._0_8_;
          auVar54 = divpd(auVar53,_DAT_0108f930);
          auVar43 = divpd(auVar56,auVar19);
          auVar57 = divpd(auVar43,_DAT_0108f940);
          auVar27._8_8_ = dVar12 * auVar27._0_8_;
          auVar43 = divpd(auVar59,auVar27);
          auVar60 = divpd(auVar43,_DAT_0108f950);
          auVar51 = divpd(auVar31,_DAT_0108f960);
          auVar28._0_8_ = 1.0 / (dVar23 * dVar23);
          auVar42._8_8_ = auVar28._0_8_ / dVar12;
          auVar42._0_8_ = auVar28._0_8_;
          auVar43 = divpd(auVar42,_DAT_0108f970);
          auVar28._8_8_ = auVar28._0_8_;
          auVar31 = divpd(auVar28,auVar19);
          auVar31 = divpd(auVar31,_DAT_0108f980);
          dVar12 = ((((((((((((1.0 / (auVar27._0_8_ * dVar22)) / -115811942400.0 +
                              (1.0 / (auVar27._0_8_ * dVar45)) / 2530344960.0 +
                              (1.0 / (dVar12 * auVar27._0_8_)) / -61501440.0 +
                              (1.0 / auVar27._0_8_) * 5.871587902837903e-07 +
                              (1.0 / dVar22) / -56448.0 + 0.0003826530612244898 / dVar45 +
                             auVar54._0_8_) - auVar54._8_8_) + auVar57._0_8_) - auVar57._8_8_) +
                         auVar60._0_8_) - auVar60._8_8_) + auVar51._0_8_) - auVar51._8_8_) +
                     auVar43._0_8_) - auVar43._8_8_) + auVar31._0_8_) - auVar31._8_8_;
        }
        else {
          dVar12 = dVar24 * dVar24;
          dVar39 = dVar45 * dVar24;
          dVar12 = dVar45 * 1.1428571428571428 *
                   ((dVar12 * dVar12 * dVar45 * -122880.0 +
                    dVar12 * dVar39 * 3840.0 +
                    dVar45 * dVar12 * -576.0 + dVar45 * -8.0 + dVar39 * 256.0) * dVar22 +
                   (dVar24 * 60.0 + -2.0) * 3.5449077018110318 * dVar23 +
                   (dVar24 * dVar12 * 5120.0 + dVar12 * -1440.0 + dVar24 * 224.0 + -35.0) *
                   dVar39 * 24.0) + 1.0;
        }
        dVar45 = (auVar25._0_8_ * dVar21) / 18.0;
        dVar21 = 1.35;
        if (dVar45 <= 1.35) {
          dVar21 = dVar45;
        }
        dVar22 = erf((1.0 / dVar21) * 0.5);
        dVar23 = exp((-1.0 / (dVar21 * dVar21)) * 0.25);
        if (1.35 <= dVar45) {
          if (dVar45 <= 1.35) {
            dVar45 = 1.35;
          }
          auVar49._0_8_ = dVar45 * dVar45;
          dVar21 = auVar49._0_8_ * auVar49._0_8_;
          auVar49._8_8_ = dVar21;
          dVar45 = dVar21 * dVar21;
          auVar37._0_8_ = auVar49._0_8_ * dVar21;
          auVar37._8_8_ = dVar45 * dVar45;
          auVar25 = divpd(_DAT_0101f460,auVar49);
          auVar51 = divpd(auVar25,_DAT_0102ddd0);
          auVar29._8_8_ = dVar45;
          auVar29._0_8_ = auVar37._0_8_;
          auVar43 = divpd(_DAT_0101f460,auVar29);
          uVar44 = auVar43._8_8_;
          auVar20._8_8_ = 0x3ff0000000000000;
          auVar20._0_8_ = uVar44;
          auVar25 = divpd(auVar20,auVar37);
          auVar30._8_8_ = uVar44;
          auVar30._0_8_ = uVar44;
          auVar31 = divpd(auVar30,auVar49);
          auVar43 = divpd(auVar43,_DAT_0102dde0);
          auVar31 = divpd(auVar31,_DAT_0102ddf0);
          auVar25 = divpd(auVar25,_DAT_0102de00);
          local_1b8 = ((((((auVar51._0_8_ - auVar51._8_8_) + auVar43._0_8_) - auVar43._8_8_) +
                        auVar31._0_8_) - auVar31._8_8_) + auVar25._0_8_) - auVar25._8_8_;
        }
        else {
          local_1b8 = dVar21 * -2.6666666666666665 *
                      (dVar22 * 1.7724538509055159 +
                      (dVar23 + -1.5 + (dVar23 + -1.0) * dVar21 * dVar21 * -2.0) * (dVar21 + dVar21)
                      ) + 1.0;
        }
        dVar21 = dVar13 / 36.0 +
                 (dVar15 + dVar34 * -0.125) * 1.8171205928321397 * dVar32 * 0.25 + -0.45;
        dVar21 = pow(dVar8 * dVar21 * -1.0814814814814815 * (1.0 - dVar8) +
                     dVar21 * dVar21 * 0.7209876543209877 +
                     (dVar13 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397 *
                     dVar32 * 0.4166666666666667 * dVar34 + 1.0,0.1);
        dVar45 = 0.0;
        if (dVar52 < dVar7 * 0.5) {
          dVar7 = 1.0 / (dVar38 * dVar38);
          dVar52 = dVar11 + 1.0;
          dVar52 = (1.0 / (dVar52 * dVar52)) * (dVar11 * 3.0 + dVar8 * dVar8);
          dVar45 = dVar10 * dVar9 * dVar33 * -0.36927938319101117 *
                   ((1.0 - dVar52) * dVar21 +
                   ((((dVar34 * 0.011867481666666667 +
                      auVar40._8_8_ * 3.3019272488946267 * 0.256337604 + dVar16) *
                      0.5555555555555556 * -1.8171205928321397 * dVar32 +
                     dVar13 * 0.06394332777777778 + 1.0) * 0.7777777777777778 * dVar7 + 1.0 / dVar38
                    ) * dVar52 -
                   ((local_168 * (1.0 / dVar38) +
                     dVar32 * 1.8171205928321397 * dVar7 *
                     (dVar34 * 0.04229627833333333 +
                     (auVar40._8_8_ * 3.3019272488946267 * 0.043662396 - dVar16)) * dVar14 *
                     0.43209876543209874 +
                    dVar32 * dVar12 * 1.8171205928321397 * 0.026329605555555555 * dVar34 * dVar7) *
                    dVar52 + local_1b8 * (1.0 - dVar52) * dVar21) * p->cam_beta));
          dVar45 = dVar45 + dVar45;
        }
        pdVar2 = out->zk;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar4 = (long)(p->dim).zk * sVar5;
          pdVar2[lVar4] = dVar45 + pdVar2[lVar4];
        }
      }
      sVar5 = sVar5 + 1;
    } while (np != sVar5);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}